

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

int __thiscall
TPZSkylMatrix<double>::Decompose_Cholesky_blk(TPZSkylMatrix<double> *this,int64_t blk_sz)

{
  long lVar1;
  double dVar2;
  char cVar3;
  double **ppdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  int iVar14;
  undefined4 extraout_var;
  long lVar16;
  long lVar17;
  double *pdVar18;
  ostream *poVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  ulong uVar43;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  double dVar51;
  long local_c8;
  long local_b8;
  long local_b0;
  long local_a0;
  long local_98;
  long lVar15;
  
  cVar3 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed;
  if (cVar3 != '\0') {
    if (cVar3 == '\x03') {
      return 1;
    }
    TPZMatrix<double>::Error
              ("int TPZSkylMatrix<double>::Decompose_Cholesky_blk(int64_t) [TVar = double]",
               "Decompose_Cholesky <Matrix already Decomposed>");
  }
  iVar14 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
             [0xc])();
  lVar15 = CONCAT44(extraout_var,iVar14);
  local_b0 = -8;
  local_c8 = 1;
  local_b8 = 8;
  dVar51 = 0.0;
  lVar31 = 0;
  auVar49 = _DAT_012bc100;
  auVar50 = _DAT_012bc110;
  do {
    if (lVar15 <= lVar31) {
      (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\x03';
      (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = '\x01';
      return 1;
    }
    lVar16 = blk_sz + lVar31;
    lVar17 = lVar16;
    if (lVar15 < lVar16) {
      lVar17 = lVar15;
    }
    lVar17 = lVar17 + lVar31;
    local_98 = local_c8;
    local_a0 = local_b0;
    lVar29 = local_b8;
    lVar32 = lVar31;
    while( true ) {
      if (lVar15 <= lVar32) break;
      ppdVar4 = (this->fElem).fStore;
      pdVar5 = ppdVar4[lVar32];
      pdVar6 = ppdVar4[lVar32 + 1];
      if ((long)pdVar6 - (long)pdVar5 == 0) {
        return 0;
      }
      lVar27 = (long)pdVar6 - (long)pdVar5 >> 3;
      lVar1 = lVar32 + 1;
      lVar25 = lVar1 - lVar27;
      if (lVar25 < lVar31) {
        lVar25 = lVar31;
      }
      lVar26 = lVar32;
      if (lVar17 < lVar32) {
        lVar26 = lVar17;
      }
      lVar27 = local_98 - lVar27;
      if (lVar27 < lVar31) {
        lVar27 = lVar31;
      }
      uVar28 = (ulong)((long)pdVar6 + ((lVar27 * 8 + local_a0) - (long)pdVar5)) >> 3;
      lVar27 = lVar29 + lVar27 * -8 + (long)pdVar5;
      uVar20 = uVar28 & 0xffffffff;
      iVar14 = 0;
      for (; lVar25 < lVar26; lVar25 = lVar25 + 1) {
        pdVar18 = pdVar5 + (lVar32 - lVar25);
        pdVar7 = ppdVar4[lVar25];
        uVar22 = (ulong)((long)ppdVar4[lVar25 + 1] + (-8 - (long)pdVar7)) >> 3;
        uVar21 = (uint)uVar22;
        uVar24 = (uint)((ulong)((long)pdVar6 + (-8 - (long)pdVar18)) >> 3);
        if (uVar21 < uVar24) {
          uVar24 = uVar21;
        }
        if (uVar24 == 0) {
          dVar33 = 0.0;
        }
        else {
          uVar23 = (ulong)(uint)((int)uVar28 + iVar14);
          uVar22 = uVar22 & 0xffffffff;
          if (uVar22 <= uVar23) {
            uVar23 = uVar22;
          }
          lVar30 = uVar23 - 1;
          auVar34._8_4_ = (int)lVar30;
          auVar34._0_8_ = lVar30;
          auVar34._12_4_ = (int)((ulong)lVar30 >> 0x20);
          if (uVar20 < uVar22) {
            uVar22 = uVar20;
          }
          auVar34 = auVar34 ^ auVar50;
          uVar23 = 0;
          dVar33 = 0.0;
          dVar2 = -0.0;
          do {
            dVar13 = dVar2;
            dVar12 = dVar33;
            auVar36._8_4_ = (int)uVar23;
            auVar36._0_8_ = uVar23;
            auVar36._12_4_ = (int)(uVar23 >> 0x20);
            auVar36 = (auVar36 | auVar49) ^ auVar50;
            auVar44._0_4_ = -(uint)(auVar34._0_4_ < auVar36._0_4_);
            auVar44._4_4_ = -(uint)(auVar34._4_4_ < auVar36._4_4_);
            auVar44._8_4_ = -(uint)(auVar34._8_4_ < auVar36._8_4_);
            auVar44._12_4_ = -(uint)(auVar34._12_4_ < auVar36._12_4_);
            auVar37._4_4_ = -(uint)(auVar36._4_4_ == auVar34._4_4_);
            auVar37._12_4_ = -(uint)(auVar36._12_4_ == auVar34._12_4_);
            auVar37._0_4_ = auVar37._4_4_;
            auVar37._8_4_ = auVar37._12_4_;
            auVar38._4_4_ = auVar44._4_4_;
            auVar38._0_4_ = auVar44._4_4_;
            auVar38._8_4_ = auVar44._12_4_;
            auVar38._12_4_ = auVar44._12_4_;
            auVar36 = auVar37 & auVar44 | auVar38;
            dVar33 = dVar12;
            dVar2 = dVar13;
            if ((~auVar36._0_4_ & 1) != 0) {
              dVar33 = *(double *)(lVar27 + uVar23 * 8);
              dVar2 = 0.0;
              in_XMM6._8_8_ = 0;
              in_XMM6._0_8_ = pdVar7[uVar23 + 1];
            }
            if (((auVar36._8_2_ ^ 0xffff) & 1) != 0) {
              dVar2 = *(double *)(lVar27 + 8 + uVar23 * 8);
              in_XMM6._8_8_ = pdVar7[uVar23 + 2];
            }
            dVar33 = dVar33 * in_XMM6._0_8_ + dVar12;
            dVar2 = dVar2 * in_XMM6._8_8_ + dVar13;
            uVar23 = uVar23 + 2;
          } while ((uVar22 + 1 & 0xfffffffffffffffe) != uVar23);
          auVar35._4_4_ = auVar44._0_4_;
          auVar35._0_4_ = auVar44._0_4_;
          auVar35._8_4_ = auVar44._8_4_;
          auVar35._12_4_ = auVar44._8_4_;
          auVar38 = auVar37 & auVar35 | auVar38;
          uVar23 = auVar38._0_8_;
          uVar43 = auVar38._8_8_;
          uVar22 = (ulong)dVar13 & uVar43;
          auVar39._0_8_ = ~uVar23 & (ulong)dVar33;
          auVar39._8_8_ = ~uVar43 & (ulong)dVar2;
          auVar8._8_4_ = (int)uVar22;
          auVar8._0_8_ = (ulong)dVar12 & uVar23;
          auVar8._12_4_ = (int)(uVar22 >> 0x20);
          dVar33 = SUB168(auVar39 | auVar8,8) + SUB168(auVar39 | auVar8,0);
        }
        *pdVar18 = (*pdVar18 - dVar33) / dVar51;
        iVar14 = iVar14 + 1;
        lVar27 = lVar27 + -8;
        uVar20 = (ulong)((int)uVar20 + 1);
      }
      if (lVar32 <= lVar17) {
        ppdVar4 = (this->fElem).fStore;
        pdVar5 = ppdVar4[lVar32];
        pdVar6 = ppdVar4[lVar1];
        dVar51 = 0.0;
        if (pdVar5 + 1 < pdVar6) {
          pdVar18 = pdVar5 + 2;
          if (pdVar5 + 2 < pdVar6) {
            pdVar18 = pdVar6;
          }
          uVar28 = (long)pdVar18 + (-9 - (long)pdVar5);
          uVar24 = (uint)(uVar28 >> 0x20);
          auVar46 = ZEXT816(0x8000000000000000) << 0x40;
          uVar20 = 0;
          do {
            dVar51 = auVar46._0_8_;
            dVar33 = auVar46._8_8_;
            auVar40._8_4_ = (int)uVar20;
            auVar40._0_8_ = uVar20;
            auVar40._12_4_ = (int)(uVar20 >> 0x20);
            auVar9._4_4_ = uVar24 >> 3;
            auVar9._0_4_ = (int)(uVar28 >> 3);
            auVar9._8_4_ = (int)(uVar28 >> 3);
            auVar9._12_4_ = uVar24 >> 3;
            auVar47 = auVar9 ^ auVar50;
            auVar34 = (auVar40 | auVar49) ^ auVar50;
            auVar45._0_4_ = -(uint)(auVar47._0_4_ < auVar34._0_4_);
            auVar45._4_4_ = -(uint)(auVar47._4_4_ < auVar34._4_4_);
            auVar45._8_4_ = -(uint)(auVar47._8_4_ < auVar34._8_4_);
            auVar45._12_4_ = -(uint)(auVar47._12_4_ < auVar34._12_4_);
            auVar41._4_4_ = -(uint)(auVar34._4_4_ == auVar47._4_4_);
            auVar41._12_4_ = -(uint)(auVar34._12_4_ == auVar47._12_4_);
            auVar41._0_4_ = auVar41._4_4_;
            auVar41._8_4_ = auVar41._12_4_;
            auVar48._4_4_ = auVar45._4_4_;
            auVar48._0_4_ = auVar45._4_4_;
            auVar48._8_4_ = auVar45._12_4_;
            auVar48._12_4_ = auVar45._12_4_;
            auVar48 = auVar41 & auVar45 | auVar48;
            if ((~auVar48._0_4_ & 1) != 0) {
              auVar47._8_8_ = 0;
              auVar47._0_8_ = pdVar5[uVar20 + 1];
            }
            auVar11._8_4_ = 0xffffffff;
            auVar11._0_8_ = 0xffffffffffffffff;
            auVar11._12_4_ = 0xffffffff;
            in_XMM6 = auVar48 ^ auVar11;
            if ((in_XMM6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar47._8_8_ = pdVar5[uVar20 + 2];
            }
            auVar46._0_8_ = auVar47._0_8_ * auVar47._0_8_ + dVar51;
            auVar46._8_8_ = auVar47._8_8_ * auVar47._8_8_ + dVar33;
            uVar20 = uVar20 + 2;
          } while (((uVar28 >> 3) + 2 & 0xfffffffffffffffe) != uVar20);
          auVar10._4_4_ = auVar45._0_4_;
          auVar10._0_4_ = auVar45._0_4_;
          auVar10._8_4_ = auVar45._8_4_;
          auVar10._12_4_ = auVar45._8_4_;
          auVar42._4_4_ = auVar45._4_4_;
          auVar42._0_4_ = auVar45._4_4_;
          auVar42._8_4_ = auVar45._12_4_;
          auVar42._12_4_ = auVar45._12_4_;
          auVar42 = auVar41 & auVar10 | auVar42;
          uVar28 = auVar42._0_8_;
          uVar20 = auVar42._8_8_;
          dVar51 = (double)(~uVar20 & (ulong)auVar46._8_8_ | (ulong)dVar33 & uVar20) +
                   (double)(~uVar28 & (ulong)auVar46._0_8_ | (ulong)dVar51 & uVar28);
        }
        dVar51 = *pdVar5 - dVar51;
        if ((dVar51 < 0.0) || (ABS(dVar51) < 1e-12)) {
          std::operator<<((ostream *)&std::cout,
                          "TPZSkylMatrix::DecomposeCholesky a matrix nao e positiva definida");
          poVar19 = std::ostream::_M_insert<double>(dVar51);
          std::endl<char,std::char_traits<char>>(poVar19);
          auVar49 = _DAT_012bc100;
          auVar50 = _DAT_012bc110;
          break;
        }
        if (dVar51 < 0.0) {
          dVar33 = sqrt(dVar51);
          auVar49 = _DAT_012bc100;
          auVar50 = _DAT_012bc110;
        }
        else {
          dVar33 = SQRT(dVar51);
        }
        *pdVar5 = dVar33;
      }
      local_a0 = local_a0 + -8;
      local_98 = local_98 + 1;
      lVar29 = lVar29 + 8;
      lVar32 = lVar1;
    }
    local_b0 = local_b0 + blk_sz * -8;
    local_c8 = local_c8 + blk_sz;
    local_b8 = local_b8 + blk_sz * 8;
    lVar31 = lVar16;
    if (lVar32 < lVar15) {
      return 0;
    }
  } while( true );
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_Cholesky_blk(int64_t blk_sz)
{
    if(this->fDecomposed == ECholesky) 
        return 1;
    if (this->fDecomposed )  
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_Cholesky <Matrix already Decomposed>" );
    
    TVar pivot = (TVar)0.;
    TVar minpivot = 10000.;
    int64_t dimension = this->Dim();
    
    for (int64_t blk_i = 0; blk_i < dimension; blk_i += blk_sz) {
        int64_t first_row = blk_i;
        int64_t first_col = blk_i;
        int64_t last_row  = blk_i + MIN(dimension,blk_i+blk_sz);
        
        // Compute band inner nodes
        for ( int64_t j = first_col; j < dimension; j++) {
            
            if (Size(j) == 0)   
                return( 0 ); // Size of column cannot be zero.
            
            int64_t first_i = MAX(first_row, (j+1)-Size(j));
            int64_t last_i = MIN(last_row, j); // j-1 becase we do not need to compute u(j,j)
            for ( int64_t i = first_i; i < last_i; i++) {
                
                // Compute u(i,j) = (a_ij - SUM_k_1_to_i-1 (u_ki * u_kj) ) / uii 
                
                //	TVar  u_ii = fElem[i][0];
                int64_t I = j-i; // fElem[j][I] = A(i,j) I = j-i
                TVar* u_ij = &fElem[j][I];
                
                TVar sum = 0.0;
                TVar *elem_kj = u_ij+1;
                TVar *end_kj  = fElem[j+1];
                TVar *elem_ki = &fElem[i][1];
                TVar *end_ki  = fElem[i+1];
                
                // Faz sum = SOMA( A(i,p) * A(k,p) ), p = 1,..,k-1.
                sum = 0.0;
                
                unsigned max_l = end_kj - elem_kj;
                unsigned tmp = end_ki - elem_ki;
                if (tmp < max_l) max_l = tmp;
#pragma clang loop vectorize_width(2)
                for(unsigned l=0; l<max_l; l++)
                    sum += (*elem_kj++) * (*elem_ki++);
                
                *u_ij = (*u_ij - sum) / pivot;
            } 
            
            // After computing all the elements of this column, compute the diagonal (ujj)
            if (last_i == j)
            {
                TVar sum = 0.0;
                TVar* u_jj = &fElem[j][0];
                TVar *elem_k = fElem[j]+1;
                TVar *end_k  = fElem[j+1];
#pragma clang loop vectorize_width(2)
                for ( ; elem_k < end_k; elem_k++ ) sum += (*elem_k) * (*elem_k);
                pivot = *u_jj - sum;
                
                minpivot = minpivot < pivot ? minpivot : pivot;
                
                if ( pivot < ((TVar)0.) || IsZero(pivot) ) {
                    cout << "TPZSkylMatrix::DecomposeCholesky a matrix nao e positiva definida" << pivot << endl;
                    return( 0 );
                }
                // Valor do elemento da diagonal k,k
                *u_jj = sqrt( pivot );
            }
        }
    }	
    this->fDecomposed  = ECholesky;
    this->fDefPositive = 1;
    return( 1 );
}